

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidgetPrivate::emitItemDoubleClicked(QTableWidgetPrivate *this,QModelIndex *index)

{
  QTableModel *this_00;
  QTableWidgetItem *pQVar1;
  QModelIndex *in_RSI;
  QTableWidgetPrivate *in_RDI;
  QTableWidgetItem *item;
  QTableWidget *q;
  QTableWidgetItem *in_stack_ffffffffffffffc8;
  QModelIndex *in_stack_ffffffffffffffe0;
  
  this_00 = (QTableModel *)q_func(in_RDI);
  tableModel((QTableWidgetPrivate *)0x8d9820);
  pQVar1 = QTableModel::item(this_00,in_stack_ffffffffffffffe0);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    QTableWidget::itemDoubleClicked((QTableWidget *)0x8d9849,in_stack_ffffffffffffffc8);
  }
  QModelIndex::row(in_RSI);
  QModelIndex::column(in_RSI);
  QTableWidget::cellDoubleClicked
            ((QTableWidget *)0x8d9879,(int)((ulong)this_00 >> 0x20),(int)this_00);
  return;
}

Assistant:

void QTableWidgetPrivate::emitItemDoubleClicked(const QModelIndex &index)
{
    Q_Q(QTableWidget);
    if (QTableWidgetItem *item = tableModel()->item(index))
        emit q->itemDoubleClicked(item);
    emit q->cellDoubleClicked(index.row(), index.column());
}